

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

QPalette __thiscall QApplicationPrivate::basePalette(QApplicationPrivate *this)

{
  ColorGroup CVar1;
  QPalettePrivate *pQVar2;
  long lVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  long in_FS_OFFSET;
  QPalette QVar5;
  QPalette local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined4 *)this = 0xaaaaaaaa;
  *(undefined4 *)&this->field_0x4 = 0xaaaaaaaa;
  *(undefined4 *)&this->field_0x8 = 0xaaaaaaaa;
  *(undefined4 *)&this->field_0xc = 0xaaaaaaaa;
  if (app_style == (QStyle *)0x0) {
    QPalette::QPalette((QPalette *)this,gray);
  }
  else {
    (**(code **)(*(long *)app_style + 0xa8))(this);
  }
  if (QGuiApplicationPrivate::platform_theme == (long *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x50))
                      (QGuiApplicationPrivate::platform_theme,0);
  }
  if (lVar3 != 0) {
    QPalette::resolve(&local_30);
    CVar1 = *(ColorGroup *)&this->field_0x8;
    *(ColorGroup *)&this->field_0x8 = local_30.currentGroup;
    pQVar2 = *(QPalettePrivate **)this;
    *(QPalettePrivate **)this = local_30.d;
    local_30.d = pQVar2;
    local_30.currentGroup = CVar1;
    QPalette::~QPalette(&local_30);
  }
  QPalette::setResolveMask((ulonglong)this);
  uVar4 = extraout_RDX;
  if (app_style != (QStyle *)0x0) {
    (**(code **)(*(long *)app_style + 0x80))(app_style,this);
    uVar4 = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QVar5._8_8_ = uVar4;
    QVar5.d = (QPalettePrivate *)this;
    return QVar5;
  }
  __stack_chk_fail();
}

Assistant:

QPalette QApplicationPrivate::basePalette() const
{
    // Start out with a palette based on the style, in case there's no theme
    // available, or so that we can fill in missing roles in the theme.
    QPalette palette = app_style ? app_style->standardPalette() : Qt::gray;

    // Prefer theme palette if available, but fill in missing roles from style
    // for compatibility. Note that the style's standard palette is not prioritized
    // over the theme palette, as the documented way of applying the style's palette
    // is to set it explicitly using QApplication::setPalette().
    if (const QPalette *themePalette = platformTheme() ? platformTheme()->palette() : nullptr)
        palette = themePalette->resolve(palette);

    // This palette now is Qt-generated, so reset the resolve mask. This allows
    // QStyle::polish implementations to respect palettes that are user provided,
    // by checking if the palette has a brush set for a color that the style might
    // otherwise overwrite.
    palette.setResolveMask(0);

    // Finish off by letting the application style polish the palette. This will
    // not result in the polished palette becoming a user-set palette, as the
    // resulting base palette is only used as a fallback, with the resolve mask
    // set to 0.
    if (app_style)
        app_style->polish(palette);

    return palette;
}